

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  sqlite3_value *psVar2;
  undefined8 *in_RDI;
  u8 mallocFailed;
  int rc;
  sqlite3_value *unaff_retaddr;
  sqlite3 *db;
  int err_code;
  sqlite3 *db_00;
  int n;
  
  db_00 = (sqlite3 *)*in_RDI;
  err_code = *(int *)((long)in_RDI + 0x84);
  if (in_RDI[9] == 0) {
    sqlite3Error(db_00,err_code);
  }
  else {
    uVar1 = db_00->mallocFailed;
    sqlite3BeginBenignMalloc();
    n = (int)((ulong)in_RDI >> 0x20);
    if (db_00->pErr == (sqlite3_value *)0x0) {
      psVar2 = sqlite3ValueNew(db_00);
      db_00->pErr = psVar2;
    }
    sqlite3ValueSetStr(unaff_retaddr,n,db_00,(u8)((uint)err_code >> 0x18),
                       (_func_void_void_ptr *)0x1395b9);
    sqlite3EndBenignMalloc();
    db_00->mallocFailed = uVar1;
    db_00->errCode = err_code;
  }
  return err_code;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc);
  }
  return rc;
}